

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

pair<unsigned_long,_rangeless::fn::impl::X> * __thiscall
rangeless::fn::impl::maybe<std::pair<unsigned_long,_rangeless::fn::impl::X>_>::operator*
          (maybe<std::pair<unsigned_long,_rangeless::fn::impl::X>_> *this)

{
  if (this->m_empty != true) {
    return (pair<unsigned_long,_rangeless::fn::impl::X> *)this;
  }
  __assert_fail("!m_empty",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                ,199,
                "T &rangeless::fn::impl::maybe<std::pair<unsigned long, rangeless::fn::impl::X>>::operator*() [T = std::pair<unsigned long, rangeless::fn::impl::X>]"
               );
}

Assistant:

T& operator*() noexcept
        {
            assert(!m_empty);

#if __cplusplus >= 201703L
            return *std::launder(&m_value);
#else
            return m_value;
#endif
        }